

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20250127::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  size_t sVar1;
  ctrl_t *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  uintptr_t v;
  slot_type *ppuVar5;
  ulong uVar6;
  size_t hash;
  size_t extraout_RDX;
  size_t hash_00;
  byte bVar7;
  size_t sVar8;
  ctrl_t cVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  FindInfo FVar13;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  slot_type *local_58;
  HeapOrSoo local_50;
  size_t local_40;
  byte local_38;
  char local_37;
  byte local_36;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, absl::container_internal::HashEq<const upb_MiniTable *>::Hash, absl::container_internal::HashEq<const upb_MiniTable *>::Eq, std::allocator<const upb_MiniTable *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, Hash = absl::container_internal::HashEq<const upb_MiniTable *>::Hash, Eq = absl::container_internal::HashEq<const upb_MiniTable *>::Eq, Alloc = std::allocator<const upb_MiniTable *>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("(!set->fits_in_soo(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe93,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, absl::container_internal::HashEq<const upb_MiniTable *>::Hash, absl::container_internal::HashEq<const upb_MiniTable *>::Eq, std::allocator<const upb_MiniTable *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, Hash = absl::container_internal::HashEq<const upb_MiniTable *>::Hash, Eq = absl::container_internal::HashEq<const upb_MiniTable *>::Eq, Alloc = std::allocator<const upb_MiniTable *>]"
                 );
  }
  sVar1 = common->capacity_;
  if (sVar1 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, absl::container_internal::HashEq<const upb_MiniTable *>::Hash, absl::container_internal::HashEq<const upb_MiniTable *>::Eq, std::allocator<const upb_MiniTable *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, Hash = absl::container_internal::HashEq<const upb_MiniTable *>::Hash, Eq = absl::container_internal::HashEq<const upb_MiniTable *>::Eq, Alloc = std::allocator<const upb_MiniTable *>]"
                 );
  }
  if (sVar1 == 1) {
    AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20250127::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                *)common);
    bVar12 = 1 < common->size_;
  }
  else {
    bVar12 = false;
  }
  bVar7 = 0x80;
  if (bVar12 != false) {
    ppuVar5 = soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20250127::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                        *)common);
    uVar6 = ((ulong)*ppuVar5 ^ 0x853410) * -0x234dd359734ecb13;
    bVar7 = (byte)(((uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                     (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                     (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                     (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38) ^ (ulong)*ppuVar5) *
                   0x5cb22ca68cb134ed >> 0x38) & 0x7f;
  }
  local_40 = common->capacity_;
  local_38 = (byte)common->size_ & 1;
  local_37 = sVar1 == 1;
  local_50.heap.control = (common->heap_or_soo_).heap.control;
  local_50.heap.slot_array =
       (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
  local_36 = bVar12;
  CommonFields::set_capacity(common,new_capacity);
  bVar4 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,8ul,true,true,8ul>
                    ((HashSetResizeHelper *)&local_50,common,&local_59,(int)(char)bVar7,8,8);
  if (local_40 == 0) {
    __assert_fail("(resize_helper.old_capacity() > 0) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xeb6,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, absl::container_internal::HashEq<const upb_MiniTable *>::Hash, absl::container_internal::HashEq<const upb_MiniTable *>::Eq, std::allocator<const upb_MiniTable *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const upb_MiniTable *>, Hash = absl::container_internal::HashEq<const upb_MiniTable *>::Hash, Eq = absl::container_internal::HashEq<const upb_MiniTable *>::Eq, Alloc = std::allocator<const upb_MiniTable *>]"
                 );
  }
  if ((bVar12 | sVar1 != 1) == 1) {
    local_58 = slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_upb_MiniTable_*>,_absl::lts_20250127::container_internal::HashEq<const_upb_MiniTable_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_upb_MiniTable_*,_void>::Eq,_std::allocator<const_upb_MiniTable_*>_>
                           *)common);
    uVar3 = local_50.heap.slot_array;
    if (!bVar4) {
      if (sVar1 == 1) {
        uVar6 = ((ulong)local_50.heap.control ^ 0x853410) * -0x234dd359734ecb13;
        uVar10 = ((uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                   (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                   (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28
                  | uVar6 << 0x38) ^ (ulong)local_50.heap.control) * -0x234dd359734ecb13;
        FVar13 = find_first_non_full<void>
                           ((container_internal *)common,
                            (CommonFields *)
                            (uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                             (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                             (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                             (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38),hash);
        uVar11 = FVar13.offset;
        uVar6 = common->capacity_;
        if (uVar6 <= uVar11) {
LAB_0021d856:
          __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x744,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar9 = (ctrl_t)(uVar10 >> 0x38) & ~kEmpty;
        pcVar2 = (common->heap_or_soo_).heap.control;
        pcVar2[uVar11] = cVar9;
        pcVar2[(ulong)((uint)uVar6 & 0xf) + (uVar11 - 0xf & uVar6)] = cVar9;
        common->capacity_ = 0xffffffffffffff9c;
        local_58[uVar11] = (slot_type)local_50.heap.control;
        CommonFields::set_capacity(common,uVar6);
      }
      else {
        if (local_37 == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_40 != 0) {
          sVar8 = 0;
          hash_00 = hash;
          do {
            if (local_37 == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (kSentinel < local_50.heap.control[sVar8]) {
              uVar6 = *(ulong *)(uVar3 + sVar8 * 8);
              uVar11 = (uVar6 ^ (ulong)&hash_internal::MixingHashState::kSeed) * -0x234dd359734ecb13
              ;
              uVar10 = ((uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                         (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                         (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                         (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38) ^ uVar6) * -0x234dd359734ecb13;
              FVar13 = find_first_non_full<void>
                                 ((container_internal *)common,
                                  (CommonFields *)
                                  (uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                                   (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8
                                   | (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                                   (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38),hash_00);
              uVar11 = FVar13.offset;
              uVar6 = common->capacity_;
              if (uVar6 <= uVar11) goto LAB_0021d856;
              cVar9 = (ctrl_t)(uVar10 >> 0x38) & ~kEmpty;
              pcVar2 = (common->heap_or_soo_).heap.control;
              pcVar2[uVar11] = cVar9;
              pcVar2[(ulong)((uint)uVar6 & 0xf) + (uVar11 - 0xf & uVar6)] = cVar9;
              common->capacity_ = 0xffffffffffffff9c;
              local_58[uVar11] = *(slot_type *)(uVar3 + sVar8 * 8);
              CommonFields::set_capacity(common,uVar6);
              hash_00 = extraout_RDX;
            }
            sVar8 = sVar8 + 1;
          } while (sVar8 != local_40);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      if (sVar1 != 1) {
        HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_50,&local_5a,8);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }